

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O2

RefCntAutoPtr<Diligent::FramebufferVkImpl> * __thiscall
Diligent::RefCntAutoPtr<Diligent::FramebufferVkImpl>::operator=
          (RefCntAutoPtr<Diligent::FramebufferVkImpl> *this,FramebufferVkImpl *pObj)

{
  FramebufferVkImpl *this_00;
  
  this_00 = this->m_pObject;
  if (this_00 != pObj) {
    if (this_00 != (FramebufferVkImpl *)0x0) {
      DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
      ::Release((DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
                 *)this_00);
    }
    this->m_pObject = pObj;
    if (pObj != (FramebufferVkImpl *)0x0) {
      RefCountedObject<Diligent::IFramebufferVk>::AddRef
                ((RefCountedObject<Diligent::IFramebufferVk> *)pObj);
    }
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(T* pObj) noexcept
    {
        if (m_pObject != pObj)
        {
            if (m_pObject)
                m_pObject->Release();
            m_pObject = pObj;
            if (m_pObject)
                m_pObject->AddRef();
        }
        return *this;
    }